

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

void __thiscall MDDOpts::parse_arg(MDDOpts *this,string *arg)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  
  bVar1 = std::operator==(in_RSI,in_RDI);
  if (bVar1) {
    in_RDI[0] = '\0';
    in_RDI[1] = '\0';
    in_RDI[2] = '\0';
    in_RDI[3] = '\0';
  }
  else {
    bVar1 = std::operator==(in_RSI,in_RDI);
    if (bVar1) {
      in_RDI[0] = '\x01';
      in_RDI[1] = '\0';
      in_RDI[2] = '\0';
      in_RDI[3] = '\0';
    }
    else {
      bVar1 = std::operator==(in_RSI,in_RDI);
      if (bVar1) {
        in_RDI[4] = '\0';
        in_RDI[5] = '\0';
        in_RDI[6] = '\0';
        in_RDI[7] = '\0';
      }
      else {
        bVar1 = std::operator==(in_RSI,in_RDI);
        if (bVar1) {
          in_RDI[4] = '\x01';
          in_RDI[5] = '\0';
          in_RDI[6] = '\0';
          in_RDI[7] = '\0';
        }
      }
    }
  }
  return;
}

Assistant:

void parse_arg(const std::string& arg) {
		if (arg == "explain_minimal") {
			expl_alg = E_MINIMAL;
		} else if (arg == "explain_greedy") {
			expl_alg = E_GREEDY;
		} else if (arg == "discard_explanations") {
			expl_strat = E_TEMP;
		} else if (arg == "store_explanations") {
			expl_strat = E_KEEP;
		}
	}